

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_ManVectorAffinity(Gia_Man_t *p,Vec_Int_t *vSuper,Vec_Int_t *vDelay,word *Matrix,int nLimit)

{
  Vec_Int_t *p_00;
  uint nSizeNew;
  int j;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Gia_Obj_t *pObj;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint local_45c;
  int Levels [256];
  
  nSizeNew = vSuper->nSize;
  if ((int)nSizeNew < 3) {
    __assert_fail("nSize > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x366,
                  "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)");
  }
  if (nSizeNew < 0x41) {
    Gia_ManIncrementTravId(p);
    p_00 = &p->vCopies;
    for (lVar6 = 0; lVar6 < vSuper->nSize; lVar6 = lVar6 + 1) {
      iVar1 = Vec_IntEntry(vSuper,(int)lVar6);
      iVar2 = Abc_Lit2Var(iVar1);
      Gia_ObjSetTravIdCurrentId(p,iVar2);
      iVar1 = Abc_Lit2Var(iVar1);
      Vec_IntWriteEntry(p_00,iVar1,(int)lVar6);
      Matrix[lVar6] = 0x8000000000000000 >> ((byte)lVar6 & 0x3f);
      Levels[lVar6] = 0;
    }
    iVar1 = 1;
    uVar8 = 0;
    local_45c = nSizeNew;
    do {
      uVar5 = vSuper->nSize;
      if ((long)(int)uVar5 <= (long)uVar8) goto LAB_00649032;
      iVar2 = Vec_IntEntry(vSuper,(int)uVar8);
      iVar2 = Abc_Lit2Var(iVar2);
      pObj = Gia_ManObj(p,iVar2);
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        iVar2 = 0;
        do {
          if (iVar2 == 0) {
            iVar3 = Gia_ObjId(p,pObj);
            uVar5 = (uint)*(undefined8 *)pObj;
          }
          else {
            if (iVar2 == 2) break;
            iVar3 = Gia_ObjId(p,pObj);
            uVar5 = *(uint *)&pObj->field_0x4;
          }
          iVar3 = iVar3 - (uVar5 & 0x1fffffff);
          iVar4 = Gia_ObjIsTravIdCurrentId(p,iVar3);
          if (iVar4 == 0) {
            if (vSuper->nSize == nLimit) break;
            Gia_ObjSetTravIdCurrentId(p,iVar3);
            iVar4 = vSuper->nSize;
            Matrix[iVar4] = 0;
            Levels[iVar4] = iVar1;
            Vec_IntWriteEntry(p_00,iVar3,iVar4);
            iVar4 = Abc_Var2Lit(iVar3,0);
            Vec_IntPush(vSuper,iVar4);
          }
          uVar7 = Matrix[uVar8];
          iVar3 = Vec_IntEntry(p_00,iVar3);
          Matrix[iVar3] = Matrix[iVar3] | uVar7;
          iVar2 = iVar2 + 1;
        } while( true );
      }
      iVar2 = Gia_ObjIsMux(p,pObj);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFaninId2p(p,pObj);
        iVar3 = Gia_ObjIsTravIdCurrentId(p,iVar2);
        if (iVar3 == 0) {
          uVar5 = nLimit;
          if (vSuper->nSize == nLimit) goto LAB_00649032;
          Gia_ObjSetTravIdCurrentId(p,iVar2);
          iVar3 = vSuper->nSize;
          Matrix[iVar3] = 0;
          Levels[iVar3] = iVar1;
          Vec_IntWriteEntry(p_00,iVar2,iVar3);
          iVar3 = Abc_Var2Lit(iVar2,0);
          Vec_IntPush(vSuper,iVar3);
        }
        uVar7 = Matrix[uVar8];
        iVar2 = Vec_IntEntry(p_00,iVar2);
        Matrix[iVar2] = Matrix[iVar2] | uVar7;
      }
      if (uVar8 == local_45c) {
        local_45c = vSuper->nSize;
        iVar1 = iVar1 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (iVar1 != 8);
    uVar5 = vSuper->nSize;
LAB_00649032:
    uVar7 = 0;
    uVar8 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar8 = uVar7;
    }
    iVar1 = 0;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      uVar10 = Matrix[uVar7];
      if (uVar10 == 0) {
        __assert_fail("Matrix[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x3a5,
                      "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)"
                     );
      }
      if (((uVar10 & uVar10 - 1) != 0) && (uVar10 != -1L << (-(char)nSizeNew & 0x3fU))) {
        Matrix[iVar1] = uVar10;
        Levels[iVar1] = Levels[uVar7];
        iVar1 = iVar1 + 1;
        if (iVar1 == 0x40) {
          iVar1 = 0x40;
          break;
        }
      }
    }
    for (lVar6 = (long)iVar1; lVar6 < 0x40; lVar6 = lVar6 + 1) {
      Matrix[lVar6] = 0;
    }
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      uVar8 = 0xffffffff;
      uVar5 = 0x20;
      while (uVar5 != 0) {
        for (uVar9 = 0; (int)uVar9 < 0x40; uVar9 = uVar9 + uVar5 + 1 & ~uVar5) {
          uVar7 = Matrix[(int)(uVar9 + uVar5)];
          uVar10 = (uVar7 >> (sbyte)uVar5 ^ Matrix[(int)uVar9]) & uVar8;
          Matrix[(int)uVar9] = Matrix[(int)uVar9] ^ uVar10;
          Matrix[(int)(uVar9 + uVar5)] = uVar10 << (sbyte)uVar5 ^ uVar7;
        }
        uVar5 = uVar5 >> 1;
        uVar8 = uVar8 ^ uVar8 << (sbyte)uVar5;
      }
    }
    Vec_IntShrink(vSuper,nSizeNew);
  }
  else {
    iVar1 = 0;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      Matrix[lVar6] = 0;
    }
  }
  return iVar1;
}

Assistant:

int Str_ManVectorAffinity( Gia_Man_t * p, Vec_Int_t * vSuper, Vec_Int_t * vDelay, word Matrix[256], int nLimit )
{
    int fVerbose = 0;
    int Levels[256];
    int nSize = Vec_IntSize(vSuper);
    int Prev = nSize, nLevels = 1;
    int i, k, iLit, iFanin, nSizeNew;
    word Mask; 
    assert( nSize > 2 );
    if ( nSize > 64 )
    {
        for ( i = 0; i < 64; i++ )
            Matrix[i] = 0;
        return 0;
    }
    // mark current nodes
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Abc_Lit2Var(iLit) );
        Str_ManSetNum( p, Abc_Lit2Var(iLit), i );
        Matrix[i] = ((word)1) << (63-i);
        Levels[i] = 0;
    }
    // collect 64 nodes
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            for ( k = 0; k < 2; k++ )
            {
                iFanin = k ? Gia_ObjFaninId1p(p, pObj) : Gia_ObjFaninId0p(p, pObj);
                if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
                {
                    if ( Vec_IntSize(vSuper) == nLimit )
                        break;
                    Gia_ObjSetTravIdCurrentId( p, iFanin );
                    Matrix[Vec_IntSize(vSuper)] = 0;
                    Levels[Vec_IntSize(vSuper)] = nLevels;
                    Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                    Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
                }
                Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
            }
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {
            iFanin = Gia_ObjFaninId2p(p, pObj);
            if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
            {
                if ( Vec_IntSize(vSuper) == nLimit )
                    break;
                Gia_ObjSetTravIdCurrentId( p, iFanin );
                Matrix[Vec_IntSize(vSuper)] = 0;
                Levels[Vec_IntSize(vSuper)] = nLevels;
                Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
            }
            Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
        }
        if ( Prev == i )
            Prev = Vec_IntSize(vSuper), nLevels++;
        if ( nLevels == 8 )
            break;
    }

    // remove those that have all 1s or only one 1
    Mask = (~(word)0) << (64 - nSize);
    for ( k = i = 0; i < Vec_IntSize(vSuper); i++ )
    {
        assert( Matrix[i] );
        if ( (Matrix[i] & (Matrix[i] - 1)) == 0 )
            continue;
        if ( Matrix[i] == Mask )
            continue;
        Matrix[k] = Matrix[i];
        Levels[k] = Levels[i];
        k++;
        if ( k == 64 )
            break;
    }
    // clean the remaining ones
    for ( i = k; i < 64; i++ )
        Matrix[i] = 0;
    nSizeNew = k;
    if ( nSizeNew == 0 )
    {
        Vec_IntShrink( vSuper, nSize );
        return 0;
    }
/*
    // report
    if ( fVerbose && nSize > 20 )
    {
        for ( i = 0; i < nSizeNew; i++ )
            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        printf( "\n" );
    }
*/
    transpose64( Matrix );

    // report
    if ( fVerbose && nSize > 10 )
    {
        printf( "Gate inputs = %d.  Collected fanins = %d.  All = %d.  Good = %d.  Levels = %d\n", 
            nSize, Vec_IntSize(vSuper) - nSize, Vec_IntSize(vSuper), nSizeNew, nLevels );
        printf( "                     " );
        for ( i = 0; i < nSizeNew; i++ )
            printf( "%d", Levels[i] );
        printf( "\n" );
        for ( i = 0; i < nSize; i++ )
        {
            printf( "%6d : ", Abc_Lit2Var(Vec_IntEntry(vSuper, i)) );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) >> 4 );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) & 15 );
//            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        }
        i = 0;
    }
    Vec_IntShrink( vSuper, nSize );
    return nSizeNew;
}